

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  float fVar3;
  ImGuiContext *unaff_retaddr;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdc;
  byte in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 uVar4;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  int i_00;
  undefined2 in_stack_ffffffffffffffec;
  byte in_stack_ffffffffffffffee;
  byte in_stack_ffffffffffffffef;
  ImVec2 in_stack_fffffffffffffff0;
  ImGuiContext *pIVar5;
  
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    pIVar5 = GImGui;
    CallContextHooks(unaff_retaddr,(ImGuiContextHookType)((ulong)GImGui >> 0x20));
    ErrorCheckEndFrameSanityChecks();
    uVar4 = false;
    if ((pIVar5->IO).ImeSetInputScreenPosFn != (_func_void_int_int *)0x0) {
      fVar3 = (pIVar5->PlatformImeLastPos).x;
      in_stack_ffffffffffffffde = true;
      if ((fVar3 != 3.4028235e+38) || (uVar4 = in_stack_ffffffffffffffde, NAN(fVar3))) {
        in_stack_fffffffffffffff0 =
             operator-((ImVec2 *)
                       (ulong)CONCAT16(1,CONCAT15(in_stack_ffffffffffffffdd,
                                                  CONCAT14(in_stack_ffffffffffffffdc,
                                                           in_stack_ffffffffffffffd8))),
                       (ImVec2 *)0x1373a8);
        fVar3 = ImLengthSqr((ImVec2 *)&stack0xfffffffffffffff0);
        in_stack_ffffffffffffffde = 0.0001 < fVar3;
        uVar4 = in_stack_ffffffffffffffde;
      }
    }
    if ((bool)uVar4 != false) {
      (*(pIVar5->IO).ImeSetInputScreenPosFn)
                ((int)(pIVar5->PlatformImePos).x,(int)(pIVar5->PlatformImePos).y);
      pIVar5->PlatformImeLastPos = pIVar5->PlatformImePos;
    }
    pIVar5->WithinFrameScopeWithImplicitWindow = false;
    if ((pIVar5->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((pIVar5->CurrentWindow->WriteAccessed & 1U) == 0)) {
      pIVar5->CurrentWindow->Active = false;
    }
    End();
    NavEndFrame();
    if ((pIVar5->DragDropActive & 1U) != 0) {
      in_stack_ffffffffffffffef = (pIVar5->DragDropPayload).Delivery & 1;
      in_stack_ffffffffffffffdd = 0;
      if (((pIVar5->DragDropPayload).DataFrameCount + 1 < pIVar5->FrameCount) &&
         (in_stack_ffffffffffffffdc = 1, in_stack_ffffffffffffffdd = in_stack_ffffffffffffffdc,
         (pIVar5->DragDropSourceFlags & 0x20U) == 0)) {
        bVar1 = IsMouseDown(pIVar5->DragDropMouseButton);
        in_stack_ffffffffffffffdc = bVar1 ^ 0xff;
        in_stack_ffffffffffffffdd = in_stack_ffffffffffffffdc;
      }
      in_stack_ffffffffffffffee = in_stack_ffffffffffffffdd & 1;
      if (((in_stack_ffffffffffffffef & 1) != 0) || (in_stack_ffffffffffffffee != 0)) {
        ClearDragDrop();
      }
    }
    if ((((pIVar5->DragDropActive & 1U) != 0) &&
        (pIVar5->DragDropSourceFrameCount < pIVar5->FrameCount)) &&
       ((pIVar5->DragDropSourceFlags & 1U) == 0)) {
      pIVar5->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar5->DragDropWithinSource = false;
    }
    pIVar5->WithinFrameScope = false;
    pIVar5->FrameCountEnded = pIVar5->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    ImVector<ImGuiWindow_*>::resize
              ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    ImVector<ImGuiWindow_*>::reserve
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
               CONCAT13(in_stack_ffffffffffffffef,
                        CONCAT12(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec)));
    for (i_00 = 0; i_00 != (pIVar5->Windows).Size; i_00 = i_00 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar5->Windows,i_00);
      in_stack_ffffffffffffffe0 = *ppIVar2;
      if (((in_stack_ffffffffffffffe0->Active & 1U) == 0) ||
         ((in_stack_ffffffffffffffe0->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer
                  ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
                   (ImGuiWindow *)
                   CONCAT17(in_stack_ffffffffffffffef,
                            CONCAT16(in_stack_ffffffffffffffee,
                                     CONCAT24(in_stack_ffffffffffffffec,i_00))));
      }
    }
    ImVector<ImGuiWindow_*>::swap(&pIVar5->Windows,&pIVar5->WindowsTempSortBuffer);
    (pIVar5->IO).MetricsActiveWindows = pIVar5->WindowsActiveCount;
    ((pIVar5->IO).Fonts)->Locked = false;
    (pIVar5->IO).MouseWheelH = 0.0;
    (pIVar5->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar4,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    memset((pIVar5->IO).NavInputs,0,0x54);
    CallContextHooks(unaff_retaddr,(ImGuiContextHookType)((ulong)pIVar5 >> 0x20));
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}